

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

string * __thiscall
cmGeneratorTarget::GetSOName(string *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  ImportInfo *pIVar4;
  long lVar5;
  Names local_e0;
  
  bVar3 = cmTarget::IsImported(this->Target);
  if (bVar3) {
    pIVar4 = GetImportInfo(this,config);
    if (pIVar4 == (ImportInfo *)0x0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    }
    else if (pIVar4->NoSOName == true) {
      cmsys::SystemTools::GetFilenameName(__return_storage_ptr__,&pIVar4->Location);
    }
    else {
      lVar5 = std::__cxx11::string::find((char *)&pIVar4->SOName,0x5376a1,0);
      if (lVar5 == 0) {
        std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&pIVar4->SOName);
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar2 = (pIVar4->SOName)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,pcVar2,
                   pcVar2 + (pIVar4->SOName)._M_string_length);
      }
    }
  }
  else {
    GetLibraryNames(&local_e0,this,config);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    paVar1 = &local_e0.SharedObject.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0.SharedObject._M_dataplus._M_p == paVar1) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_e0.SharedObject.field_2._M_allocated_capacity._1_7_,
                    local_e0.SharedObject.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) =
           local_e0.SharedObject.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_e0.SharedObject._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_e0.SharedObject.field_2._M_allocated_capacity._1_7_,
                    local_e0.SharedObject.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = local_e0.SharedObject._M_string_length;
    local_e0.SharedObject._M_string_length = 0;
    local_e0.SharedObject.field_2._M_local_buf[0] = '\0';
    local_e0.SharedObject._M_dataplus._M_p = (pointer)paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0.PDB._M_dataplus._M_p != &local_e0.PDB.field_2) {
      operator_delete(local_e0.PDB._M_dataplus._M_p,local_e0.PDB.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0.ImportLibrary._M_dataplus._M_p != &local_e0.ImportLibrary.field_2) {
      operator_delete(local_e0.ImportLibrary._M_dataplus._M_p,
                      local_e0.ImportLibrary.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0.Real._M_dataplus._M_p != &local_e0.Real.field_2) {
      operator_delete(local_e0.Real._M_dataplus._M_p,local_e0.Real.field_2._M_allocated_capacity + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0.Output._M_dataplus._M_p != &local_e0.Output.field_2) {
      operator_delete(local_e0.Output._M_dataplus._M_p,
                      local_e0.Output.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0.Base._M_dataplus._M_p != &local_e0.Base.field_2) {
      operator_delete(local_e0.Base._M_dataplus._M_p,local_e0.Base.field_2._M_allocated_capacity + 1
                     );
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetSOName(const std::string& config) const
{
  if (this->IsImported()) {
    // Lookup the imported soname.
    if (cmGeneratorTarget::ImportInfo const* info =
          this->GetImportInfo(config)) {
      if (info->NoSOName) {
        // The imported library has no builtin soname so the name
        // searched at runtime will be just the filename.
        return cmSystemTools::GetFilenameName(info->Location);
      }
      // Use the soname given if any.
      if (info->SOName.find("@rpath/") == 0) {
        return info->SOName.substr(6);
      }
      return info->SOName;
    }
    return "";
  }
  // Compute the soname that will be built.
  return this->GetLibraryNames(config).SharedObject;
}